

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::draw_rectangle
          (CImg<unsigned_char> *this,int x0,int y0,int z0,int c0,int x1,int y1,int z1,int c1,
          uchar val,float opacity)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  int __x;
  CImg<unsigned_char> *in_RDI;
  CImg<unsigned_char> *pCVar5;
  uint in_R8D;
  uint in_R9D;
  float in_XMM0_Da;
  float extraout_XMM0_Da;
  type tVar6;
  uint in_stack_00000008;
  uint in_stack_00000010;
  uint in_stack_00000018;
  byte in_stack_00000020;
  int x;
  int y;
  int z;
  int v;
  uchar *ptrd;
  float copacity;
  float nopacity;
  uint offZ;
  uint offY;
  uint offX;
  int lC;
  int lZ;
  int lY;
  int lX;
  int nc1;
  int nc0;
  int nz1;
  int nz0;
  int ny1;
  int ny0;
  int nx1;
  int nx0;
  bool bc;
  bool bz;
  bool by;
  bool bx;
  uint local_124;
  uint local_11c;
  uint local_114;
  uint local_10c;
  uint local_108;
  int local_100;
  uint local_f4;
  int local_ec;
  uint local_e0;
  int local_d8;
  uint local_cc;
  int local_c4;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  byte *local_80;
  int local_74;
  float local_70;
  float local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  undefined1 local_2c;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  float local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  
  local_28 = in_XMM0_Da;
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  bVar2 = is_empty(in_RDI);
  if (!bVar2) {
    local_29 = (int)local_14 < (int)local_24;
    local_2a = (int)local_18 < (int)in_stack_00000008;
    local_2b = (int)local_1c < (int)in_stack_00000010;
    local_2c = (int)local_20 < (int)in_stack_00000018;
    if ((bool)local_29) {
      local_9c = local_14;
    }
    else {
      local_9c = local_24;
    }
    local_30 = local_9c;
    if ((bool)local_29) {
      local_a0 = local_24;
    }
    else {
      local_a0 = local_14;
    }
    local_34 = local_a0;
    if ((bool)local_2a) {
      local_a4 = local_18;
    }
    else {
      local_a4 = in_stack_00000008;
    }
    local_38 = local_a4;
    if ((bool)local_2a) {
      local_a8 = in_stack_00000008;
    }
    else {
      local_a8 = local_18;
    }
    local_3c = local_a8;
    if ((bool)local_2b) {
      local_ac = local_1c;
    }
    else {
      local_ac = in_stack_00000010;
    }
    local_40 = local_ac;
    if ((bool)local_2b) {
      local_b0 = in_stack_00000010;
    }
    else {
      local_b0 = local_1c;
    }
    local_44 = local_b0;
    if ((bool)local_2c) {
      local_b4 = local_20;
    }
    else {
      local_b4 = in_stack_00000018;
    }
    local_48 = local_b4;
    if ((bool)local_2c) {
      local_b8 = in_stack_00000018;
    }
    else {
      local_b8 = local_20;
    }
    local_4c = local_b8;
    iVar3 = width(in_RDI);
    if ((int)local_a0 < iVar3) {
      local_c4 = 0;
    }
    else {
      iVar3 = width(in_RDI);
      local_c4 = (iVar3 + -1) - local_34;
    }
    uVar1 = local_3c;
    if ((int)local_30 < 0) {
      local_cc = local_30;
    }
    else {
      local_cc = 0;
    }
    local_50 = ((local_a0 + 1) - local_9c) + local_c4 + local_cc;
    iVar3 = (local_3c + 1) - local_38;
    iVar4 = height(in_RDI);
    if ((int)uVar1 < iVar4) {
      local_d8 = 0;
    }
    else {
      iVar4 = height(in_RDI);
      local_d8 = (iVar4 + -1) - local_3c;
    }
    uVar1 = local_44;
    if ((int)local_38 < 0) {
      local_e0 = local_38;
    }
    else {
      local_e0 = 0;
    }
    local_54 = iVar3 + local_d8 + local_e0;
    iVar3 = (local_44 + 1) - local_40;
    iVar4 = depth(in_RDI);
    if ((int)uVar1 < iVar4) {
      local_ec = 0;
    }
    else {
      iVar4 = depth(in_RDI);
      local_ec = (iVar4 + -1) - local_44;
    }
    uVar1 = local_4c;
    if ((int)local_40 < 0) {
      local_f4 = local_40;
    }
    else {
      local_f4 = 0;
    }
    local_58 = iVar3 + local_ec + local_f4;
    iVar3 = (local_4c + 1) - local_48;
    pCVar5 = in_RDI;
    iVar4 = spectrum(in_RDI);
    __x = (int)pCVar5;
    if ((int)uVar1 < iVar4) {
      local_100 = 0;
    }
    else {
      pCVar5 = in_RDI;
      iVar4 = spectrum(in_RDI);
      __x = (int)pCVar5;
      local_100 = (iVar4 + -1) - local_4c;
    }
    if ((int)local_48 < 0) {
      local_108 = local_48;
    }
    else {
      local_108 = 0;
    }
    local_5c = iVar3 + local_100 + local_108;
    local_60 = in_RDI->_width - local_50;
    local_64 = in_RDI->_width * (in_RDI->_height - local_54);
    local_68 = in_RDI->_width * in_RDI->_height * (in_RDI->_depth - local_58);
    cimg::abs(__x);
    local_74 = 0;
    local_6c = extraout_XMM0_Da;
    tVar6 = cimg::max<float,int>(&local_28,&local_74);
    local_70 = 1.0 - tVar6;
    if ((int)local_30 < 0) {
      local_10c = 0;
    }
    else {
      local_10c = local_30;
    }
    if ((int)local_38 < 0) {
      local_114 = 0;
    }
    else {
      local_114 = local_38;
    }
    if ((int)local_40 < 0) {
      local_11c = 0;
    }
    else {
      local_11c = local_40;
    }
    if ((int)local_48 < 0) {
      local_124 = 0;
    }
    else {
      local_124 = local_48;
    }
    local_80 = data(in_RDI,local_10c,local_114,local_11c,local_124);
    if ((((0 < local_50) && (0 < local_54)) && (0 < local_58)) && (0 < local_5c)) {
      for (local_84 = 0; local_84 < local_5c; local_84 = local_84 + 1) {
        for (local_88 = 0; local_88 < local_58; local_88 = local_88 + 1) {
          for (local_8c = 0; local_8c < local_54; local_8c = local_8c + 1) {
            if (local_28 < 1.0) {
              for (local_90 = 0; local_90 < local_50; local_90 = local_90 + 1) {
                *local_80 = (byte)(int)(local_6c * (float)in_stack_00000020 +
                                       (float)*local_80 * local_70);
                local_80 = local_80 + 1;
              }
              local_80 = local_80 + local_60;
            }
            else {
              memset(local_80,(uint)in_stack_00000020,(long)local_50);
              local_80 = local_80 + in_RDI->_width;
            }
          }
          local_80 = local_80 + local_64;
        }
        local_80 = local_80 + local_68;
      }
    }
  }
  return in_RDI;
}

Assistant:

CImg<T>& draw_rectangle(const int x0, const int y0, const int z0, const int c0,
                            const int x1, const int y1, const int z1, const int c1,
                            const T val, const float opacity=1) {
      if (is_empty()) return *this;
      const bool bx = (x0<x1), by = (y0<y1), bz = (z0<z1), bc = (c0<c1);
      const int
        nx0 = bx?x0:x1, nx1 = bx?x1:x0,
        ny0 = by?y0:y1, ny1 = by?y1:y0,
        nz0 = bz?z0:z1, nz1 = bz?z1:z0,
        nc0 = bc?c0:c1, nc1 = bc?c1:c0;
      const int
        lX = (1 + nx1 - nx0) + (nx1>=width()?width() - 1 - nx1:0) + (nx0<0?nx0:0),
        lY = (1 + ny1 - ny0) + (ny1>=height()?height() - 1 - ny1:0) + (ny0<0?ny0:0),
        lZ = (1 + nz1 - nz0) + (nz1>=depth()?depth() - 1 - nz1:0) + (nz0<0?nz0:0),
        lC = (1 + nc1 - nc0) + (nc1>=spectrum()?spectrum() - 1 - nc1:0) + (nc0<0?nc0:0);
      const unsigned int offX = _width - lX, offY = _width*(_height - lY), offZ = _width*_height*(_depth - lZ);
      const float nopacity = cimg::abs(opacity), copacity = 1 - cimg::max(opacity,0);
      T *ptrd = data(nx0<0?0:nx0,ny0<0?0:ny0,nz0<0?0:nz0,nc0<0?0:nc0);
      if (lX>0 && lY>0 && lZ>0 && lC>0)
        for (int v = 0; v<lC; ++v) {
          for (int z = 0; z<lZ; ++z) {
            for (int y = 0; y<lY; ++y) {
              if (opacity>=1) {
                if (sizeof(T)!=1) { for (int x = 0; x<lX; ++x) *(ptrd++) = val; ptrd+=offX; }
                else { std::memset(ptrd,(int)val,lX); ptrd+=_width; }
              } else { for (int x = 0; x<lX; ++x) { *ptrd = (T)(nopacity*val + *ptrd*copacity); ++ptrd; } ptrd+=offX; }
            }
            ptrd+=offY;
          }
          ptrd+=offZ;
        }
      return *this;
    }